

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aco_solver.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pcVar3;
  string *psVar4;
  string *psVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  char *pcVar7;
  int max_apertures;
  uint uVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  long *plVar16;
  undefined8 *puVar17;
  ostream *poVar18;
  ACS *this;
  uint uVar19;
  long *plVar20;
  size_type *psVar21;
  int n;
  ulong uVar22;
  uint __val;
  int i;
  uint __len;
  long lVar23;
  initializer_list<args::EitherFlag> in;
  initializer_list<args::EitherFlag> in_00;
  initializer_list<args::EitherFlag> in_01;
  initializer_list<args::EitherFlag> in_02;
  initializer_list<args::EitherFlag> in_03;
  initializer_list<args::EitherFlag> in_04;
  initializer_list<args::EitherFlag> in_05;
  initializer_list<args::EitherFlag> in_06;
  initializer_list<args::EitherFlag> in_07;
  initializer_list<args::EitherFlag> in_08;
  initializer_list<args::EitherFlag> in_09;
  initializer_list<args::EitherFlag> in_10;
  initializer_list<args::EitherFlag> in_11;
  initializer_list<args::EitherFlag> in_12;
  initializer_list<args::EitherFlag> in_13;
  initializer_list<args::EitherFlag> in_14;
  initializer_list<args::EitherFlag> in_15;
  initializer_list<args::EitherFlag> in_16;
  initializer_list<args::EitherFlag> in_17;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  vector<double,_std::allocator<double>_> w;
  vector<double,_std::allocator<double>_> Zmin;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _path;
  vector<double,_std::allocator<double>_> Zmax;
  string file;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _file2;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> volumes;
  string file2;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _file;
  Collimator collimator;
  string path;
  ValueFlag<double,_args::ValueReader<double>_> _alpha;
  ValueFlag<double,_args::ValueReader<double>_> _beta;
  ValueFlag<int,_args::ValueReader<int>_> _max_apertures;
  ValueFlag<int,_args::ValueReader<int>_> _step_intensity;
  ValueFlag<int,_args::ValueReader<int>_> _max_intensity;
  ValueFlag<int,_args::ValueReader<int>_> _initial_intensity;
  ValueFlag<int,_args::ValueReader<int>_> _seed;
  ValueFlag<int,_args::ValueReader<int>_> _open_apertures;
  ValueFlag<int,_args::ValueReader<int>_> _maxtime;
  ValueFlag<int,_args::ValueReader<int>_> _maxiter;
  Flag _plot;
  ArgumentParser parser;
  ValueFlag<int,_args::ValueReader<int>_> _maxratio;
  ValueFlag<int,_args::ValueReader<int>_> _maxdelta;
  ValueFlag<int,_args::ValueReader<int>_> _vsize;
  HelpFlag help;
  ValueFlag<int,_args::ValueReader<int>_> _bsize;
  int local_152c;
  uint local_1520;
  undefined1 local_1518 [8];
  _Alloc_hider local_1510;
  char local_1508 [8];
  char local_1500 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14f0;
  undefined1 local_14d0 [16];
  undefined1 local_14c0 [224];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13e0;
  undefined1 *local_13c0;
  long local_13b8;
  undefined1 local_13b0 [16];
  undefined1 local_13a0 [16];
  char local_1390 [8];
  char local_1388 [216];
  double local_12b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12a8;
  undefined1 *local_1288;
  long local_1280;
  undefined1 local_1278 [16];
  undefined1 local_1268 [16];
  undefined1 local_1258 [32];
  _Alloc_hider local_1238 [2];
  char local_1228 [176];
  undefined1 local_1178 [56];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1140 [7];
  char *local_fb8 [2];
  char local_fa8 [16];
  vector<double,_std::allocator<double>_> local_f98;
  vector<double,_std::allocator<double>_> local_f80;
  vector<double,_std::allocator<double>_> local_f68;
  string local_f50;
  string local_f30;
  string local_f10;
  ValueFlag<double,_args::ValueReader<double>_> local_ef0;
  undefined1 local_e18 [216];
  ValueFlag<int,_args::ValueReader<int>_> local_d40;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_c70;
  ValueFlag<int,_args::ValueReader<int>_> local_c40;
  ValueFlag<int,_args::ValueReader<int>_> local_b70;
  ValueFlag<int,_args::ValueReader<int>_> local_aa0;
  ValueFlag<int,_args::ValueReader<int>_> local_9d0;
  ValueFlag<int,_args::ValueReader<int>_> local_900;
  undefined1 local_830 [200];
  int local_768;
  undefined1 local_760 [200];
  int local_698;
  FlagBase local_690;
  ArgumentParser local_5c8;
  ValueFlag<int,_args::ValueReader<int>_> local_438;
  ValueFlag<int,_args::ValueReader<int>_> local_368;
  ValueFlag<int,_args::ValueReader<int>_> local_298;
  FlagBase local_1c8;
  ValueFlag<int,_args::ValueReader<int>_> local_100;
  
  local_13c0 = local_13b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_13c0,"data/testinstance_0_70_140_210_280.txt","");
  local_1288 = local_1278;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1288,"data/test_instance_coordinates.txt","");
  local_fb8[0] = local_fa8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fb8,".","");
  uVar15 = time((time_t *)0x0);
  local_1520 = (uint)uVar15;
  local_1178._0_8_ = local_1178 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1178,"********* IMRT-Solver (ACO solver) *********","");
  local_1268._0_8_ = local_1258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1268,
             "Example.\n./ACO -s ibo_ls --maxiter=400 --maxdelta=8 --maxratio=6 --alpha=0.999 --beta=0.999 --bsize=5 --vsize=20 --max-apertures=4 --seed=0 --open-apertures=1 --initial-intensity=4 --step-intensity=1 --file-dep=data/Equidistantes/equidist00.txt --file-coord=data/Equidistantes/equidist-coord.txt"
             ,"");
  args::ArgumentParser::ArgumentParser(&local_5c8,(string *)local_1178,(string *)local_1268);
  if ((undefined1 *)local_1268._0_8_ != local_1258) {
    operator_delete((void *)local_1268._0_8_);
  }
  if ((undefined1 *)local_1178._0_8_ != local_1178 + 0x10) {
    operator_delete((void *)local_1178._0_8_);
  }
  local_13a0._0_8_ = local_1390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13a0,"help","");
  local_14d0._0_8_ = local_14c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_14d0,"Display this help menu","");
  pcVar2 = local_1258 + 8;
  local_1268._0_2_ = 0x6801;
  local_1258._0_8_ = 0;
  local_1258[8] = '\0';
  local_1258._24_2_ = 0;
  local_1238[0]._M_p = local_1228;
  local_1268._8_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1238,"help","");
  in._M_len = 2;
  in._M_array = (iterator)local_1268;
  args::Matcher::Matcher((Matcher *)local_1178,in);
  args::Flag::Flag((Flag *)&local_1c8,&local_5c8.super_Group,(string *)local_13a0,
                   (string *)local_14d0,(Matcher *)local_1178,false);
  local_1c8.super_NamedBase.super_Base._vptr_Base = (_func_int **)&PTR__FlagBase_0013c7a8;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_1140);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_1178);
  lVar23 = 0;
  do {
    pcVar7 = *(char **)((long)&local_1238[0]._M_p + lVar23);
    if (local_1228 + lVar23 != pcVar7) {
      operator_delete(pcVar7);
    }
    lVar23 = lVar23 + -0x28;
  } while (lVar23 != -0x50);
  if ((undefined1 *)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  if ((char *)local_13a0._0_8_ != local_1390) {
    operator_delete((void *)local_13a0._0_8_);
  }
  local_13a0._0_8_ = local_1390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13a0,"int","");
  pcVar3 = local_e18 + 0x10;
  local_e18._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct((ulong)local_e18,'\x02');
  *(undefined2 *)local_e18._0_8_ = 0x3032;
  plVar16 = (long *)std::__cxx11::string::replace((ulong)local_e18,0,(char *)0x0,0x12d271);
  psVar4 = &local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  plVar20 = plVar16 + 2;
  if ((string *)*plVar16 == (string *)plVar20) {
    local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p =
         (pointer)*plVar20;
    local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_string_length =
         plVar16[3];
    local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
         (_func_int **)psVar4;
  }
  else {
    local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p =
         (pointer)*plVar20;
    local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
         (_func_int **)*plVar16;
  }
  local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._8_8_ = plVar16[1];
  *plVar16 = (long)plVar20;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_ef0);
  psVar21 = (size_type *)(plVar16 + 2);
  if ((size_type *)*plVar16 == psVar21) {
    local_14c0._0_8_ = *psVar21;
    local_14c0._8_4_ = (undefined4)plVar16[3];
    local_14c0._12_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
    local_14d0._0_8_ = local_14c0;
  }
  else {
    local_14c0._0_8_ = *psVar21;
    local_14d0._0_8_ = (size_type *)*plVar16;
  }
  local_14d0._8_8_ = plVar16[1];
  *plVar16 = (long)psVar21;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  local_1268._0_8_ = local_1268._0_8_ & 0xffffffffffff0000;
  local_1268._8_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1268 + 8),"bsize","");
  in_00._M_len = 1;
  in_00._M_array = (iterator)local_1268;
  args::Matcher::Matcher((Matcher *)local_1178,in_00);
  local_298.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_100,&local_5c8.super_Group,(string *)local_13a0,(string *)local_14d0,
             (Matcher *)local_1178,(int *)&local_298,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_1140);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_1178);
  if ((pointer)local_1268._8_8_ != pcVar2) {
    operator_delete((void *)local_1268._8_8_);
  }
  if ((undefined1 *)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  if ((string *)local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar4) {
    operator_delete(local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((pointer)local_e18._0_8_ != pcVar3) {
    operator_delete((void *)local_e18._0_8_);
  }
  if ((char *)local_13a0._0_8_ != local_1390) {
    operator_delete((void *)local_13a0._0_8_);
  }
  local_13a0._0_8_ = local_1390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13a0,"int","");
  local_e18._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct((ulong)local_e18,'\x02');
  *(undefined2 *)local_e18._0_8_ = 0x3035;
  plVar16 = (long *)std::__cxx11::string::replace((ulong)local_e18,0,(char *)0x0,0x12d2a5);
  plVar20 = plVar16 + 2;
  if ((string *)*plVar16 == (string *)plVar20) {
    local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p =
         (pointer)*plVar20;
    local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_string_length =
         plVar16[3];
    local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
         (_func_int **)psVar4;
  }
  else {
    local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p =
         (pointer)*plVar20;
    local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
         (_func_int **)*plVar16;
  }
  local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._8_8_ = plVar16[1];
  *plVar16 = (long)plVar20;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_ef0);
  psVar21 = (size_type *)(plVar16 + 2);
  if ((size_type *)*plVar16 == psVar21) {
    local_14c0._0_8_ = *psVar21;
    local_14c0._8_4_ = (undefined4)plVar16[3];
    local_14c0._12_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
    local_14d0._0_8_ = local_14c0;
  }
  else {
    local_14c0._0_8_ = *psVar21;
    local_14d0._0_8_ = (size_type *)*plVar16;
  }
  local_14d0._8_8_ = plVar16[1];
  *plVar16 = (long)psVar21;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  local_1268._0_8_ = local_1268._0_8_ & 0xffffffffffff0000;
  local_1268._8_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1268 + 8),"vsize","");
  in_01._M_len = 1;
  in_01._M_array = (iterator)local_1268;
  args::Matcher::Matcher((Matcher *)local_1178,in_01);
  local_368.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_298,&local_5c8.super_Group,(string *)local_13a0,(string *)local_14d0,
             (Matcher *)local_1178,(int *)&local_368,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_1140);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_1178);
  if ((pointer)local_1268._8_8_ != pcVar2) {
    operator_delete((void *)local_1268._8_8_);
  }
  if ((undefined1 *)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  if ((string *)local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar4) {
    operator_delete(local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((pointer)local_e18._0_8_ != pcVar3) {
    operator_delete((void *)local_e18._0_8_);
  }
  if ((char *)local_13a0._0_8_ != local_1390) {
    operator_delete((void *)local_13a0._0_8_);
  }
  local_13a0._0_8_ = local_1390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13a0,"int","");
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e18,
             vsnprintf,0x148,"%f",0);
  plVar16 = (long *)std::__cxx11::string::replace((ulong)local_e18,0,(char *)0x0,0x12d2cf);
  plVar20 = plVar16 + 2;
  if ((string *)*plVar16 == (string *)plVar20) {
    local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p =
         (pointer)*plVar20;
    local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_string_length =
         plVar16[3];
    local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
         (_func_int **)psVar4;
  }
  else {
    local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p =
         (pointer)*plVar20;
    local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
         (_func_int **)*plVar16;
  }
  local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._8_8_ = plVar16[1];
  *plVar16 = (long)plVar20;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_ef0);
  psVar21 = (size_type *)(plVar16 + 2);
  if ((size_type *)*plVar16 == psVar21) {
    local_14c0._0_8_ = *psVar21;
    local_14c0._8_4_ = (undefined4)plVar16[3];
    local_14c0._12_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
    local_14d0._0_8_ = local_14c0;
  }
  else {
    local_14c0._0_8_ = *psVar21;
    local_14d0._0_8_ = (size_type *)*plVar16;
  }
  local_14d0._8_8_ = plVar16[1];
  *plVar16 = (long)psVar21;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  local_1268._0_8_ = local_1268._0_8_ & 0xffffffffffff0000;
  local_1268._8_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1268 + 8),"maxdelta","");
  in_02._M_len = 1;
  in_02._M_array = (iterator)local_1268;
  args::Matcher::Matcher((Matcher *)local_1178,in_02);
  local_438.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_368,&local_5c8.super_Group,(string *)local_13a0,(string *)local_14d0,
             (Matcher *)local_1178,(int *)&local_438,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_1140);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_1178);
  if ((pointer)local_1268._8_8_ != pcVar2) {
    operator_delete((void *)local_1268._8_8_);
  }
  if ((undefined1 *)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  if ((string *)local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar4) {
    operator_delete(local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((pointer)local_e18._0_8_ != pcVar3) {
    operator_delete((void *)local_e18._0_8_);
  }
  if ((char *)local_13a0._0_8_ != local_1390) {
    operator_delete((void *)local_13a0._0_8_);
  }
  local_13a0._0_8_ = local_1390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13a0,"int","");
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e18,
             vsnprintf,0x148,"%f",0);
  plVar16 = (long *)std::__cxx11::string::replace((ulong)local_e18,0,(char *)0x0,0x12d2e5);
  plVar20 = plVar16 + 2;
  if ((string *)*plVar16 == (string *)plVar20) {
    local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p =
         (pointer)*plVar20;
    local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_string_length =
         plVar16[3];
    local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
         (_func_int **)psVar4;
  }
  else {
    local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p =
         (pointer)*plVar20;
    local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
         (_func_int **)*plVar16;
  }
  local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._8_8_ = plVar16[1];
  *plVar16 = (long)plVar20;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_ef0);
  psVar21 = (size_type *)(plVar16 + 2);
  if ((size_type *)*plVar16 == psVar21) {
    local_14c0._0_8_ = *psVar21;
    local_14c0._8_4_ = (undefined4)plVar16[3];
    local_14c0._12_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
    local_14d0._0_8_ = local_14c0;
  }
  else {
    local_14c0._0_8_ = *psVar21;
    local_14d0._0_8_ = (size_type *)*plVar16;
  }
  local_14d0._8_8_ = plVar16[1];
  *plVar16 = (long)psVar21;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  local_1268._0_8_ = local_1268._0_8_ & 0xffffffffffff0000;
  local_1268._8_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1268 + 8),"maxratio","");
  in_03._M_len = 1;
  in_03._M_array = (iterator)local_1268;
  args::Matcher::Matcher((Matcher *)local_1178,in_03);
  local_760._0_8_ = (ulong)(uint)local_760._4_4_ << 0x20;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_438,&local_5c8.super_Group,(string *)local_13a0,(string *)local_14d0,
             (Matcher *)local_1178,(int *)local_760,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_1140);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_1178);
  if ((pointer)local_1268._8_8_ != pcVar2) {
    operator_delete((void *)local_1268._8_8_);
  }
  if ((undefined1 *)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  if ((string *)local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar4) {
    operator_delete(local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((pointer)local_e18._0_8_ != pcVar3) {
    operator_delete((void *)local_e18._0_8_);
  }
  if ((char *)local_13a0._0_8_ != local_1390) {
    operator_delete((void *)local_13a0._0_8_);
  }
  local_13a0._0_8_ = local_1390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13a0,"double","");
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_760,
             vsnprintf,0x148,"%f",0);
  puVar17 = (undefined8 *)std::__cxx11::string::replace((ulong)local_760,0,(char *)0x0,0x12d302);
  psVar21 = puVar17 + 2;
  if ((size_type *)*puVar17 == psVar21) {
    local_e18._16_8_ = *psVar21;
    local_e18._24_8_ = puVar17[3];
    local_e18._0_8_ = pcVar3;
  }
  else {
    local_e18._16_8_ = *psVar21;
    local_e18._0_8_ = (size_type *)*puVar17;
  }
  local_e18._8_8_ = puVar17[1];
  *puVar17 = psVar21;
  puVar17[1] = 0;
  *(undefined1 *)(puVar17 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append(local_e18);
  psVar21 = (size_type *)(plVar16 + 2);
  if ((size_type *)*plVar16 == psVar21) {
    local_14c0._0_8_ = *psVar21;
    local_14c0._8_4_ = (undefined4)plVar16[3];
    local_14c0._12_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
    local_14d0._0_8_ = local_14c0;
  }
  else {
    local_14c0._0_8_ = *psVar21;
    local_14d0._0_8_ = (size_type *)*plVar16;
  }
  local_14d0._8_8_ = plVar16[1];
  *plVar16 = (long)psVar21;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  local_1268._0_8_ = local_1268._0_8_ & 0xffffffffffff0000;
  local_1268._8_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1268 + 8),"alpha","");
  in_04._M_len = 1;
  in_04._M_array = (iterator)local_1268;
  args::Matcher::Matcher((Matcher *)local_1178,in_04);
  local_830._0_8_ = (pointer)0x0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            (&local_ef0,&local_5c8.super_Group,(string *)local_13a0,(string *)local_14d0,
             (Matcher *)local_1178,(double *)local_830,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_1140);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_1178);
  if ((pointer)local_1268._8_8_ != pcVar2) {
    operator_delete((void *)local_1268._8_8_);
  }
  if ((undefined1 *)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  if ((pointer)local_e18._0_8_ != pcVar3) {
    operator_delete((void *)local_e18._0_8_);
  }
  pcVar3 = local_760 + 0x10;
  if ((pointer)local_760._0_8_ != pcVar3) {
    operator_delete((void *)local_760._0_8_);
  }
  if ((char *)local_13a0._0_8_ != local_1390) {
    operator_delete((void *)local_13a0._0_8_);
  }
  local_13a0._0_8_ = local_1390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13a0,"double","");
  local_12b0 = 1.0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_830,
             vsnprintf,0x148,"%f");
  plVar16 = (long *)std::__cxx11::string::replace((ulong)local_830,0,(char *)0x0,0x12d32f);
  psVar21 = (size_type *)(plVar16 + 2);
  if ((size_type *)*plVar16 == psVar21) {
    local_760._16_8_ = *psVar21;
    local_760._24_8_ = plVar16[3];
    local_760._0_8_ = pcVar3;
  }
  else {
    local_760._16_8_ = *psVar21;
    local_760._0_8_ = (size_type *)*plVar16;
  }
  local_760._8_8_ = plVar16[1];
  *plVar16 = (long)psVar21;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append(local_760);
  psVar21 = (size_type *)(plVar16 + 2);
  if ((size_type *)*plVar16 == psVar21) {
    local_14c0._0_8_ = *psVar21;
    local_14c0._8_4_ = (undefined4)plVar16[3];
    local_14c0._12_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
    local_14d0._0_8_ = local_14c0;
  }
  else {
    local_14c0._0_8_ = *psVar21;
    local_14d0._0_8_ = (size_type *)*plVar16;
  }
  local_14d0._8_8_ = plVar16[1];
  *plVar16 = (long)psVar21;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  local_1268._0_8_ = local_1268._0_8_ & 0xffffffffffff0000;
  local_1268._8_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1268 + 8),"beta","");
  in_05._M_len = 1;
  in_05._M_array = (iterator)local_1268;
  args::Matcher::Matcher((Matcher *)local_1178,in_05);
  local_9d0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)0x0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            ((ValueFlag<double,_args::ValueReader<double>_> *)local_e18,&local_5c8.super_Group,
             (string *)local_13a0,(string *)local_14d0,(Matcher *)local_1178,(double *)&local_9d0,
             false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_1140);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_1178);
  if ((pointer)local_1268._8_8_ != pcVar2) {
    operator_delete((void *)local_1268._8_8_);
  }
  if ((undefined1 *)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  if ((pointer)local_760._0_8_ != pcVar3) {
    operator_delete((void *)local_760._0_8_);
  }
  pcVar3 = local_830 + 0x10;
  if ((pointer)local_830._0_8_ != pcVar3) {
    operator_delete((void *)local_830._0_8_);
  }
  if ((char *)local_13a0._0_8_ != local_1390) {
    operator_delete((void *)local_13a0._0_8_);
  }
  local_13a0._0_8_ = local_1390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13a0,"int","");
  psVar4 = &local_9d0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  local_9d0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar4;
  std::__cxx11::string::_M_construct((ulong)&local_9d0,'\x04');
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_9d0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                     _vptr_Base,4,5000);
  plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_9d0,0,(char *)0x0,0x12d355);
  psVar21 = (size_type *)(plVar16 + 2);
  if ((size_type *)*plVar16 == psVar21) {
    local_830._16_8_ = *psVar21;
    local_830._24_8_ = plVar16[3];
    local_830._0_8_ = pcVar3;
  }
  else {
    local_830._16_8_ = *psVar21;
    local_830._0_8_ = (size_type *)*plVar16;
  }
  local_830._8_8_ = plVar16[1];
  *plVar16 = (long)psVar21;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append(local_830);
  psVar21 = (size_type *)(plVar16 + 2);
  if ((size_type *)*plVar16 == psVar21) {
    local_14c0._0_8_ = *psVar21;
    local_14c0._8_4_ = (undefined4)plVar16[3];
    local_14c0._12_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
    local_14d0._0_8_ = local_14c0;
  }
  else {
    local_14c0._0_8_ = *psVar21;
    local_14d0._0_8_ = (size_type *)*plVar16;
  }
  local_14d0._8_8_ = plVar16[1];
  *plVar16 = (long)psVar21;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  local_1268._0_8_ = local_1268._0_8_ & 0xffffffffffff0000;
  local_1268._8_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1268 + 8),"maxiter","");
  in_06._M_len = 1;
  in_06._M_array = (iterator)local_1268;
  args::Matcher::Matcher((Matcher *)local_1178,in_06);
  local_d40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)local_d40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base.
               _4_4_ << 0x20);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)local_760,&local_5c8.super_Group,
             (string *)local_13a0,(string *)local_14d0,(Matcher *)local_1178,(int *)&local_d40,false
            );
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_1140);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_1178);
  if ((pointer)local_1268._8_8_ != pcVar2) {
    operator_delete((void *)local_1268._8_8_);
  }
  if ((undefined1 *)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  if ((pointer)local_830._0_8_ != pcVar3) {
    operator_delete((void *)local_830._0_8_);
  }
  if ((string *)local_9d0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar4) {
    operator_delete(local_9d0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((char *)local_13a0._0_8_ != local_1390) {
    operator_delete((void *)local_13a0._0_8_);
  }
  local_13a0._0_8_ = local_1390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13a0,"int","");
  psVar5 = &local_d40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  local_d40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar5;
  std::__cxx11::string::_M_construct((ulong)&local_d40,'\x01');
  *(undefined1 *)
   &((_Alloc_hider *)
    local_d40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base)->_M_p = 0x30
  ;
  plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_d40,0,(char *)0x0,0x12d374);
  plVar20 = plVar16 + 2;
  if ((string *)*plVar16 == (string *)plVar20) {
    local_9d0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p =
         (pointer)*plVar20;
    local_9d0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_string_length =
         plVar16[3];
    local_9d0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
         (_func_int **)psVar4;
  }
  else {
    local_9d0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p =
         (pointer)*plVar20;
    local_9d0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
         (_func_int **)*plVar16;
  }
  local_9d0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._8_8_ = plVar16[1];
  *plVar16 = (long)plVar20;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_9d0);
  psVar21 = (size_type *)(plVar16 + 2);
  if ((size_type *)*plVar16 == psVar21) {
    local_14c0._0_8_ = *psVar21;
    local_14c0._8_4_ = (undefined4)plVar16[3];
    local_14c0._12_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
    local_14d0._0_8_ = local_14c0;
  }
  else {
    local_14c0._0_8_ = *psVar21;
    local_14d0._0_8_ = (size_type *)*plVar16;
  }
  local_14d0._8_8_ = plVar16[1];
  *plVar16 = (long)psVar21;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  local_1268._0_8_ = local_1268._0_8_ & 0xffffffffffff0000;
  local_1268._8_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1268 + 8),"maxtime","");
  in_07._M_len = 1;
  in_07._M_array = (iterator)local_1268;
  args::Matcher::Matcher((Matcher *)local_1178,in_07);
  local_900.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)local_900.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base.
               _4_4_ << 0x20);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)local_830,&local_5c8.super_Group,
             (string *)local_13a0,(string *)local_14d0,(Matcher *)local_1178,(int *)&local_900,false
            );
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_1140);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_1178);
  if ((pointer)local_1268._8_8_ != pcVar2) {
    operator_delete((void *)local_1268._8_8_);
  }
  if ((undefined1 *)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  if ((string *)local_9d0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar4) {
    operator_delete(local_9d0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((string *)local_d40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar5) {
    operator_delete(local_d40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((char *)local_13a0._0_8_ != local_1390) {
    operator_delete((void *)local_13a0._0_8_);
  }
  local_13a0._0_8_ = local_1390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13a0,"int","");
  __val = -local_1520;
  if (0 < (int)local_1520) {
    __val = local_1520;
  }
  __len = 1;
  if (9 < __val) {
    uVar22 = (ulong)__val;
    uVar8 = 4;
    do {
      __len = uVar8;
      uVar19 = (uint)uVar22;
      if (uVar19 < 100) {
        __len = __len - 2;
        goto LAB_00107a12;
      }
      if (uVar19 < 1000) {
        __len = __len - 1;
        goto LAB_00107a12;
      }
      if (uVar19 < 10000) goto LAB_00107a12;
      uVar22 = uVar22 / 10000;
      uVar8 = __len + 4;
    } while (99999 < uVar19);
    __len = __len + 1;
  }
LAB_00107a12:
  psVar4 = &local_900.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  local_900.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar4;
  std::__cxx11::string::_M_construct((ulong)&local_900,(char)__len - ((char)(uVar15 >> 0x18) >> 7));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)&((_Alloc_hider *)
                             local_900.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base
                             ._vptr_Base)->_M_p + (uVar15 >> 0x1f & 1)),__len,__val);
  plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_900,0,(char *)0x0,0x12d396);
  psVar5 = &local_d40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  plVar20 = plVar16 + 2;
  if ((string *)*plVar16 == (string *)plVar20) {
    local_d40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p =
         (pointer)*plVar20;
    local_d40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_string_length =
         plVar16[3];
    local_d40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
         (_func_int **)psVar5;
  }
  else {
    local_d40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p =
         (pointer)*plVar20;
    local_d40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
         (_func_int **)*plVar16;
  }
  local_d40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._8_8_ = plVar16[1];
  *plVar16 = (long)plVar20;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_d40);
  psVar21 = (size_type *)(plVar16 + 2);
  if ((size_type *)*plVar16 == psVar21) {
    local_14c0._0_8_ = *psVar21;
    local_14c0._8_4_ = (undefined4)plVar16[3];
    local_14c0._12_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
    local_14d0._0_8_ = local_14c0;
  }
  else {
    local_14c0._0_8_ = *psVar21;
    local_14d0._0_8_ = (size_type *)*plVar16;
  }
  local_14d0._8_8_ = plVar16[1];
  *plVar16 = (long)psVar21;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  local_1268._0_8_ = local_1268._0_8_ & 0xffffffffffff0000;
  local_1268._8_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1268 + 8),"seed","");
  in_08._M_len = 1;
  in_08._M_array = (iterator)local_1268;
  args::Matcher::Matcher((Matcher *)local_1178,in_08);
  local_aa0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)local_aa0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base.
               _4_4_ << 0x20);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_9d0,&local_5c8.super_Group,(string *)local_13a0,(string *)local_14d0,
             (Matcher *)local_1178,(int *)&local_aa0,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_1140);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_1178);
  if ((pointer)local_1268._8_8_ != pcVar2) {
    operator_delete((void *)local_1268._8_8_);
  }
  if ((undefined1 *)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  if ((string *)local_d40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar5) {
    operator_delete(local_d40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((string *)local_900.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar4) {
    operator_delete(local_900.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((char *)local_13a0._0_8_ != local_1390) {
    operator_delete((void *)local_13a0._0_8_);
  }
  local_13a0._0_8_ = local_1390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13a0,"int","");
  psVar5 = &local_aa0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  local_aa0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar5;
  std::__cxx11::string::_M_construct((ulong)&local_aa0,'\x01');
  *(undefined1 *)
   &((_Alloc_hider *)
    local_aa0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base)->_M_p = 0x35
  ;
  plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_aa0,0,(char *)0x0,0x12d3a3);
  plVar20 = plVar16 + 2;
  if ((string *)*plVar16 == (string *)plVar20) {
    local_900.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p =
         (pointer)*plVar20;
    local_900.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_string_length =
         plVar16[3];
    local_900.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
         (_func_int **)psVar4;
  }
  else {
    local_900.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p =
         (pointer)*plVar20;
    local_900.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
         (_func_int **)*plVar16;
  }
  local_900.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._8_8_ = plVar16[1];
  *plVar16 = (long)plVar20;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_900);
  psVar21 = (size_type *)(plVar16 + 2);
  if ((size_type *)*plVar16 == psVar21) {
    local_14c0._0_8_ = *psVar21;
    local_14c0._8_4_ = (undefined4)plVar16[3];
    local_14c0._12_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
    local_14d0._0_8_ = local_14c0;
  }
  else {
    local_14c0._0_8_ = *psVar21;
    local_14d0._0_8_ = (size_type *)*plVar16;
  }
  local_14d0._8_8_ = plVar16[1];
  *plVar16 = (long)psVar21;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  local_1268._0_8_ = local_1268._0_8_ & 0xffffffffffff0000;
  local_1268._8_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1268 + 8),"max-apertures","");
  in_09._M_len = 1;
  in_09._M_array = (iterator)local_1268;
  args::Matcher::Matcher((Matcher *)local_1178,in_09);
  local_b70.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)local_b70.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base.
               _4_4_ << 0x20);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_d40,&local_5c8.super_Group,(string *)local_13a0,(string *)local_14d0,
             (Matcher *)local_1178,(int *)&local_b70,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_1140);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_1178);
  if ((pointer)local_1268._8_8_ != pcVar2) {
    operator_delete((void *)local_1268._8_8_);
  }
  if ((undefined1 *)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  if ((string *)local_900.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar4) {
    operator_delete(local_900.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((string *)local_aa0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar5) {
    operator_delete(local_aa0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((char *)local_13a0._0_8_ != local_1390) {
    operator_delete((void *)local_13a0._0_8_);
  }
  local_13a0._0_8_ = local_1390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13a0,"int","");
  psVar4 = &local_b70.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  local_b70.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar4;
  std::__cxx11::string::_M_construct((ulong)&local_b70,'\x02');
  *(undefined1 *)
   ((long)&((_Alloc_hider *)
           local_b70.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base)->_M_p
   + 1) = 0x31;
  plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_b70,0,(char *)0x0,0x12d3d6);
  plVar20 = plVar16 + 2;
  if ((string *)*plVar16 == (string *)plVar20) {
    local_aa0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p =
         (pointer)*plVar20;
    local_aa0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_string_length =
         plVar16[3];
    local_aa0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
         (_func_int **)psVar5;
  }
  else {
    local_aa0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p =
         (pointer)*plVar20;
    local_aa0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
         (_func_int **)*plVar16;
  }
  local_aa0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._8_8_ = plVar16[1];
  *plVar16 = (long)plVar20;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_aa0);
  psVar21 = (size_type *)(plVar16 + 2);
  if ((size_type *)*plVar16 == psVar21) {
    local_14c0._0_8_ = *psVar21;
    local_14c0._8_4_ = (undefined4)plVar16[3];
    local_14c0._12_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
    local_14d0._0_8_ = local_14c0;
  }
  else {
    local_14c0._0_8_ = *psVar21;
    local_14d0._0_8_ = (size_type *)*plVar16;
  }
  local_14d0._8_8_ = plVar16[1];
  *plVar16 = (long)psVar21;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  local_1268._0_8_ = local_1268._0_8_ & 0xffffffffffff0000;
  local_1268._8_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1268 + 8),"open-apertures","");
  in_10._M_len = 1;
  in_10._M_array = (iterator)local_1268;
  args::Matcher::Matcher((Matcher *)local_1178,in_10);
  local_c40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)local_c40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base.
               _4_4_ << 0x20);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_900,&local_5c8.super_Group,(string *)local_13a0,(string *)local_14d0,
             (Matcher *)local_1178,(int *)&local_c40,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_1140);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_1178);
  if ((pointer)local_1268._8_8_ != pcVar2) {
    operator_delete((void *)local_1268._8_8_);
  }
  if ((undefined1 *)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  if ((string *)local_aa0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar5) {
    operator_delete(local_aa0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((string *)local_b70.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar4) {
    operator_delete(local_b70.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((char *)local_13a0._0_8_ != local_1390) {
    operator_delete((void *)local_13a0._0_8_);
  }
  local_13a0._0_8_ = local_1390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13a0,"int","");
  psVar5 = &local_c40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  local_c40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar5;
  std::__cxx11::string::_M_construct((ulong)&local_c40,'\x01');
  *(undefined1 *)
   &((_Alloc_hider *)
    local_c40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base)->_M_p = 0x32
  ;
  plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_c40,0,(char *)0x0,0x12d41d);
  plVar20 = plVar16 + 2;
  if ((string *)*plVar16 == (string *)plVar20) {
    local_b70.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p =
         (pointer)*plVar20;
    local_b70.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_string_length =
         plVar16[3];
    local_b70.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
         (_func_int **)psVar4;
  }
  else {
    local_b70.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p =
         (pointer)*plVar20;
    local_b70.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
         (_func_int **)*plVar16;
  }
  local_b70.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._8_8_ = plVar16[1];
  *plVar16 = (long)plVar20;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_b70);
  psVar21 = (size_type *)(plVar16 + 2);
  if ((size_type *)*plVar16 == psVar21) {
    local_14c0._0_8_ = *psVar21;
    local_14c0._8_4_ = (undefined4)plVar16[3];
    local_14c0._12_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
    local_14d0._0_8_ = local_14c0;
  }
  else {
    local_14c0._0_8_ = *psVar21;
    local_14d0._0_8_ = (size_type *)*plVar16;
  }
  local_14d0._8_8_ = plVar16[1];
  *plVar16 = (long)psVar21;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  local_1268._0_8_ = local_1268._0_8_ & 0xffffffffffff0000;
  local_1268._8_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1268 + 8),"initial-intensity","")
  ;
  in_11._M_len = 1;
  in_11._M_array = (iterator)local_1268;
  args::Matcher::Matcher((Matcher *)local_1178,in_11);
  local_690.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)((ulong)local_690.super_NamedBase.super_Base._vptr_Base._4_4_ << 0x20);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_aa0,&local_5c8.super_Group,(string *)local_13a0,(string *)local_14d0,
             (Matcher *)local_1178,(int *)&local_690,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_1140);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_1178);
  if ((pointer)local_1268._8_8_ != pcVar2) {
    operator_delete((void *)local_1268._8_8_);
  }
  if ((undefined1 *)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  if ((string *)local_b70.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar4) {
    operator_delete(local_b70.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((string *)local_c40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar5) {
    operator_delete(local_c40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((char *)local_13a0._0_8_ != local_1390) {
    operator_delete((void *)local_13a0._0_8_);
  }
  local_13a0._0_8_ = local_1390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13a0,"int","");
  psVar4 = &local_690.super_NamedBase.super_Base.help;
  local_690.super_NamedBase.super_Base._vptr_Base = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct((ulong)&local_690,'\x02');
  *(undefined2 *)&((_Alloc_hider *)local_690.super_NamedBase.super_Base._vptr_Base)->_M_p = 0x3832;
  plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_690,0,(char *)0x0,0x12d453);
  plVar20 = plVar16 + 2;
  if ((string *)*plVar16 == (string *)plVar20) {
    local_c40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p =
         (pointer)*plVar20;
    local_c40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_string_length =
         plVar16[3];
    local_c40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
         (_func_int **)psVar5;
  }
  else {
    local_c40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p =
         (pointer)*plVar20;
    local_c40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
         (_func_int **)*plVar16;
  }
  local_c40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._8_8_ = plVar16[1];
  *plVar16 = (long)plVar20;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_c40);
  psVar21 = (size_type *)(plVar16 + 2);
  if ((size_type *)*plVar16 == psVar21) {
    local_14c0._0_8_ = *psVar21;
    local_14c0._8_4_ = (undefined4)plVar16[3];
    local_14c0._12_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
    local_14d0._0_8_ = local_14c0;
  }
  else {
    local_14c0._0_8_ = *psVar21;
    local_14d0._0_8_ = (size_type *)*plVar16;
  }
  local_14d0._8_8_ = plVar16[1];
  *plVar16 = (long)psVar21;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  local_1268._0_8_ = local_1268._0_8_ & 0xffffffffffff0000;
  local_1268._8_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1268 + 8),"max-intensity","");
  in_12._M_len = 1;
  in_12._M_array = (iterator)local_1268;
  args::Matcher::Matcher((Matcher *)local_1178,in_12);
  local_1518 = (undefined1  [8])((ulong)(uint)local_1518._4_4_ << 0x20);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_b70,&local_5c8.super_Group,(string *)local_13a0,(string *)local_14d0,
             (Matcher *)local_1178,(int *)local_1518,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_1140);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_1178);
  if ((pointer)local_1268._8_8_ != pcVar2) {
    operator_delete((void *)local_1268._8_8_);
  }
  if ((undefined1 *)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  if ((string *)local_c40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar5) {
    operator_delete(local_c40.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((string *)local_690.super_NamedBase.super_Base._vptr_Base != psVar4) {
    operator_delete(local_690.super_NamedBase.super_Base._vptr_Base);
  }
  if ((char *)local_13a0._0_8_ != local_1390) {
    operator_delete((void *)local_13a0._0_8_);
  }
  local_13a0._0_8_ = local_1390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13a0,"int","");
  local_1518 = (undefined1  [8])local_1508;
  std::__cxx11::string::_M_construct((ulong)local_1518,'\x01');
  *(char *)local_1518 = '2';
  plVar16 = (long *)std::__cxx11::string::replace((ulong)local_1518,0,(char *)0x0,0x12d481);
  plVar20 = plVar16 + 2;
  if ((string *)*plVar16 == (string *)plVar20) {
    local_690.super_NamedBase.super_Base.help._M_dataplus._M_p = (pointer)*plVar20;
    local_690.super_NamedBase.super_Base.help._M_string_length = plVar16[3];
    local_690.super_NamedBase.super_Base._vptr_Base = (_func_int **)psVar4;
  }
  else {
    local_690.super_NamedBase.super_Base.help._M_dataplus._M_p = (pointer)*plVar20;
    local_690.super_NamedBase.super_Base._vptr_Base = (_func_int **)*plVar16;
  }
  local_690.super_NamedBase.super_Base._8_8_ = plVar16[1];
  *plVar16 = (long)plVar20;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_690);
  psVar21 = (size_type *)(plVar16 + 2);
  if ((size_type *)*plVar16 == psVar21) {
    local_14c0._0_8_ = *psVar21;
    local_14c0._8_4_ = (undefined4)plVar16[3];
    local_14c0._12_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
    local_14d0._0_8_ = local_14c0;
  }
  else {
    local_14c0._0_8_ = *psVar21;
    local_14d0._0_8_ = (size_type *)*plVar16;
  }
  local_14d0._8_8_ = plVar16[1];
  *plVar16 = (long)psVar21;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  local_1268._0_8_ = local_1268._0_8_ & 0xffffffffffff0000;
  local_1268._8_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1268 + 8),"step-intensity","");
  in_13._M_len = 1;
  in_13._M_array = (iterator)local_1268;
  args::Matcher::Matcher((Matcher *)local_1178,in_13);
  local_14f0._M_dataplus._M_p = (pointer)((ulong)local_14f0._M_dataplus._M_p._4_4_ << 0x20);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_c40,&local_5c8.super_Group,(string *)local_13a0,(string *)local_14d0,
             (Matcher *)local_1178,(int *)&local_14f0,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_1140);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_1178);
  if ((pointer)local_1268._8_8_ != pcVar2) {
    operator_delete((void *)local_1268._8_8_);
  }
  if ((undefined1 *)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  if ((string *)local_690.super_NamedBase.super_Base._vptr_Base != psVar4) {
    operator_delete(local_690.super_NamedBase.super_Base._vptr_Base);
  }
  if (local_1518 != (undefined1  [8])local_1508) {
    operator_delete((void *)local_1518);
  }
  if ((char *)local_13a0._0_8_ != local_1390) {
    operator_delete((void *)local_13a0._0_8_);
  }
  local_13a0._0_8_ = local_1390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13a0,"bool","");
  local_14d0._0_8_ = local_14c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14d0,"Generate plot and save in file","");
  local_1268._0_8_ = local_1268._0_8_ & 0xffffffffffff0000;
  local_1268._8_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1268 + 8),"plot","");
  in_14._M_len = 1;
  in_14._M_array = (iterator)local_1268;
  args::Matcher::Matcher((Matcher *)local_1178,in_14);
  args::Flag::Flag((Flag *)&local_690,&local_5c8.super_Group,(string *)local_13a0,
                   (string *)local_14d0,(Matcher *)local_1178,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_1140);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_1178);
  if ((pointer)local_1268._8_8_ != pcVar2) {
    operator_delete((void *)local_1268._8_8_);
  }
  if ((undefined1 *)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  if ((char *)local_13a0._0_8_ != local_1390) {
    operator_delete((void *)local_13a0._0_8_);
  }
  local_14d0._0_8_ = local_14c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_14d0,"string","");
  local_1518 = (undefined1  [8])local_1508;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1518,"File with the deposition matrix","");
  local_13a0._0_8_ = local_13a0._0_8_ & 0xffffffffffff0000;
  local_13a0._8_8_ = local_1388;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_13a0 + 8),"file-dep","");
  in_15._M_len = 1;
  in_15._M_array = (iterator)local_13a0;
  args::Matcher::Matcher((Matcher *)local_1178,in_15);
  paVar1 = &local_14f0.field_2;
  local_14f0._M_string_length = 0;
  local_14f0.field_2._M_local_buf[0] = '\0';
  local_14f0._M_dataplus._M_p = (pointer)paVar1;
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1268,&local_5c8.super_Group,(string *)local_14d0,(string *)local_1518,
              (Matcher *)local_1178,&local_14f0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_14f0._M_dataplus._M_p);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_1140);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_1178);
  if ((char *)local_13a0._8_8_ != local_1388) {
    operator_delete((void *)local_13a0._8_8_);
  }
  if (local_1518 != (undefined1  [8])local_1508) {
    operator_delete((void *)local_1518);
  }
  if ((undefined1 *)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  local_1518 = (undefined1  [8])local_1508;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1518,"string","");
  local_14f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_14f0,"File with the beam coordinates","");
  local_14d0._0_8_ = local_14d0._0_8_ & 0xffffffffffff0000;
  local_14d0._8_8_ = local_14c0 + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_14d0 + 8),"file-coord","");
  in_16._M_len = 1;
  in_16._M_array = (iterator)local_14d0;
  args::Matcher::Matcher((Matcher *)local_1178,in_16);
  paVar6 = &local_13e0.field_2;
  local_13e0._M_string_length = 0;
  local_13e0.field_2._M_local_buf[0] = '\0';
  local_13e0._M_dataplus._M_p = (pointer)paVar6;
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_13a0,&local_5c8.super_Group,(string *)local_1518,&local_14f0,
              (Matcher *)local_1178,&local_13e0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13e0._M_dataplus._M_p != paVar6) {
    operator_delete(local_13e0._M_dataplus._M_p);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_1140);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_1178);
  if ((undefined1 *)local_14d0._8_8_ != local_14c0 + 8) {
    operator_delete((void *)local_14d0._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_14f0._M_dataplus._M_p);
  }
  if (local_1518 != (undefined1  [8])local_1508) {
    operator_delete((void *)local_1518);
  }
  local_14f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_14f0,"string","");
  local_13e0._M_dataplus._M_p = (pointer)paVar6;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_13e0,
             "Absolute path of the executable (if it is executed from other directory)","");
  local_1518 = (undefined1  [8])((ulong)local_1518 & 0xffffffffffff0000);
  local_1510._M_p = local_1500;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1510,"path","");
  in_17._M_len = 1;
  in_17._M_array = (iterator)local_1518;
  args::Matcher::Matcher((Matcher *)local_1178,in_17);
  local_12a8._M_string_length = 0;
  local_12a8.field_2._M_local_buf[0] = '\0';
  local_12a8._M_dataplus._M_p = (pointer)&local_12a8.field_2;
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_14d0,&local_5c8.super_Group,&local_14f0,&local_13e0,(Matcher *)local_1178,
              &local_12a8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12a8._M_dataplus._M_p != &local_12a8.field_2) {
    operator_delete(local_12a8._M_dataplus._M_p);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_1140);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_1178);
  if (local_1510._M_p != local_1500) {
    operator_delete(local_1510._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13e0._M_dataplus._M_p != paVar6) {
    operator_delete(local_13e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_14f0._M_dataplus._M_p);
  }
  args::ArgumentParser::ParseCLI(&local_5c8,argc,argv);
  (*local_100.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  (**(code **)(CONCAT44(local_298.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                        _vptr_Base._4_4_,
                        local_298.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                        _vptr_Base._0_4_) + 0x10))();
  (**(code **)(CONCAT44(local_368.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                        _vptr_Base._4_4_,
                        local_368.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                        _vptr_Base._0_4_) + 0x10))();
  (**(code **)(CONCAT44(local_438.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                        _vptr_Base._4_4_,
                        local_438.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                        _vptr_Base._0_4_) + 0x10))();
  iVar10 = (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)local_ef0.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                                super_Base._vptr_Base + 0x10))->_M_allocated_capacity)();
  if ((char)iVar10 != '\0') {
    local_12b0 = local_ef0.value;
  }
  (**(code **)(local_e18._0_8_ + 0x10))();
  cVar9 = (**(code **)(local_760._0_8_ + 0x10))();
  iVar10 = 5000;
  if (cVar9 != '\0') {
    iVar10 = local_698;
  }
  cVar9 = (**(code **)(local_830._0_8_ + 0x10))();
  iVar14 = 0;
  if (cVar9 != '\0') {
    iVar14 = local_768;
  }
  iVar11 = (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)local_d40.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                                super_Base._vptr_Base + 0x10))->_M_allocated_capacity)();
  max_apertures = 5;
  if ((char)iVar11 != '\0') {
    max_apertures = local_d40.value;
  }
  (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)local_900.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                       _vptr_Base + 0x10))->_M_allocated_capacity)();
  iVar11 = (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)local_9d0.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                                super_Base._vptr_Base + 0x10))->_M_allocated_capacity)();
  if ((char)iVar11 != '\0') {
    local_1520 = local_9d0.value;
  }
  iVar11 = (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)local_aa0.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                                super_Base._vptr_Base + 0x10))->_M_allocated_capacity)();
  local_152c = 2;
  if ((char)iVar11 != '\0') {
    local_152c = local_aa0.value;
  }
  iVar12 = (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)local_b70.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                                super_Base._vptr_Base + 0x10))->_M_allocated_capacity)();
  iVar11 = 0x1c;
  if ((char)iVar12 != '\0') {
    iVar11 = local_b70.value;
  }
  iVar13 = (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)local_c40.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                                super_Base._vptr_Base + 0x10))->_M_allocated_capacity)();
  iVar12 = 2;
  if ((char)iVar13 != '\0') {
    iVar12 = local_c40.value;
  }
  srand(local_1520);
  cVar9 = (**(code **)(local_1268._0_8_ + 0x10))();
  if (cVar9 != '\0') {
    std::__cxx11::string::_M_assign((string *)&local_13c0);
  }
  cVar9 = (**(code **)(local_13a0._0_8_ + 0x10))();
  if (cVar9 != '\0') {
    std::__cxx11::string::_M_assign((string *)&local_1288);
  }
  cVar9 = (**(code **)(local_14d0._0_8_ + 0x10))();
  if (cVar9 != '\0') {
    std::__cxx11::string::_M_assign((string *)local_fb8);
  }
  chdir(local_fb8[0]);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "##**************************************************************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "##**************************************************************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"##******** IMRT-Solver (Ant Colony Optimization) *********",0x3a
            );
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "##**************************************************************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "##**************************************************************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  local_1178._0_8_ = (pointer)0x3ff0000000000000;
  local_1178._8_8_ = 0x3ff0000000000000;
  local_1178._16_8_ = 0x3ff0000000000000;
  __l._M_len = 3;
  __l._M_array = (iterator)local_1178;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_1518,__l,(allocator_type *)&local_14f0
            );
  local_1178._0_8_ = (pointer)0x0;
  local_1178._8_8_ = 0;
  local_1178._16_8_ = 0x4053000000000000;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_1178;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_14f0,__l_00,
             (allocator_type *)&local_13e0);
  local_1178._0_8_ = (pointer)0x4050400000000000;
  local_1178._8_8_ = 0x404e000000000000;
  local_1178._16_8_ = 0x408f400000000000;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)local_1178;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_13e0,__l_01,
             (allocator_type *)&local_12a8);
  local_f10._M_dataplus._M_p = (pointer)&local_f10.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f10,local_1288,local_1288 + local_1280)
  ;
  local_f30._M_dataplus._M_p = (pointer)&local_f30.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f30,local_13c0,local_13c0 + local_13b8)
  ;
  get_angles((set<int,_std::less<int>,_std::allocator<int>_> *)&local_c70,&local_f30,n);
  imrt::Collimator::Collimator
            ((Collimator *)local_1178,&local_f10,
             (set<int,_std::less<int>,_std::allocator<int>_> *)&local_c70);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_c70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f30._M_dataplus._M_p != &local_f30.field_2) {
    operator_delete(local_f30._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f10._M_dataplus._M_p != &local_f10.field_2) {
    operator_delete(local_f10._M_dataplus._M_p);
  }
  local_f50._M_dataplus._M_p = (pointer)&local_f50.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f50,local_13c0,local_13c0 + local_13b8)
  ;
  createVolumes((vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)&local_12a8,&local_f50,
                (Collimator *)local_1178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f50._M_dataplus._M_p != &local_f50.field_2) {
    operator_delete(local_f50._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "##**************************************************************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "##*********************************** INFO *********************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "##**************************************************************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  poVar18 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,"## Solver: ",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
  std::ostream::put((char)poVar18);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##   Iterations: ",0x11)
  ;
  plVar16 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar10);
  std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
  std::ostream::put((char)plVar16);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##   Time: ",0xb);
  plVar16 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar14);
  std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
  std::ostream::put((char)plVar16);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##   Seed: ",0xb);
  plVar16 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_1520);
  std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
  std::ostream::put((char)plVar16);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##   alpha: ",0xc);
  poVar18 = std::ostream::_M_insert<double>(local_12b0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
  std::ostream::put((char)poVar18);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"##   Initial intensity: ",0x18);
  plVar16 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_152c);
  std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
  std::ostream::put((char)plVar16);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"##   Max intensity: ",0x14);
  plVar16 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar11);
  std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
  std::ostream::put((char)plVar16);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"##   Step intensity: ",0x15);
  plVar16 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar12);
  std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
  std::ostream::put((char)plVar16);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  poVar18 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,"## Colimator configuration: ",0x1c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
  std::ostream::put((char)poVar18);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##   Stations: ",0xf);
  iVar10 = imrt::Collimator::getNbAngles((Collimator *)local_1178);
  plVar16 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar10);
  std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
  std::ostream::put((char)plVar16);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##   Angles: ",0xd);
  iVar10 = 0;
  while( true ) {
    iVar14 = imrt::Collimator::getNbAngles((Collimator *)local_1178);
    if (iVar14 <= iVar10) break;
    iVar14 = imrt::Collimator::getAngle((Collimator *)local_1178,iVar10);
    poVar18 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18," ",1);
    iVar10 = iVar10 + 1;
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##   Apertures: ",0x10);
  plVar16 = (long *)std::ostream::operator<<((ostream *)&std::cout,max_apertures);
  std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
  std::ostream::put((char)plVar16);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  poVar18 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,"## Instance information: ",0x19);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
  std::ostream::put((char)poVar18);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##   Volumes: ",0xe);
  poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
  std::ostream::put((char)poVar18);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  poVar18 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar18,"##**************************************************************************",
             0x4c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
  std::ostream::put((char)poVar18);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "##********************************** SEARCH ********************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "##**************************************************************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  imrt::Collimator::generateReference((Collimator *)local_1178);
  imrt::Collimator::generateIntensityLevels((Collimator *)local_1178,iVar12,iVar11);
  this = (ACS *)operator_new(0x118);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_f68,(vector<double,_std::allocator<double>_> *)local_1518);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_f80,(vector<double,_std::allocator<double>_> *)&local_14f0);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_f98,(vector<double,_std::allocator<double>_> *)&local_13e0);
  imrt::ACS::ACS(this,&local_f68,&local_f80,&local_f98,(Collimator *)local_1178,
                 (vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)&local_12a8,max_apertures,
                 iVar11,local_152c,iVar12,10,1.0,2.0,2.0,0.2);
  if (local_f98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_f80.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_f68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  (*(this->super_ACO)._vptr_ACO[4])(this,900);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "##**************************************************************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "##******************************* RESULTS **********************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "##**************************************************************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::~vector
            ((vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)&local_12a8);
  imrt::Collimator::~Collimator((Collimator *)local_1178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13e0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_13e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14f0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_14f0._M_dataplus._M_p);
  }
  if (local_1518 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1518);
  }
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_14d0);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_13a0);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1268);
  args::FlagBase::~FlagBase(&local_690);
  args::FlagBase::~FlagBase((FlagBase *)&local_c40);
  args::FlagBase::~FlagBase((FlagBase *)&local_b70);
  args::FlagBase::~FlagBase((FlagBase *)&local_aa0);
  args::FlagBase::~FlagBase((FlagBase *)&local_900);
  args::FlagBase::~FlagBase((FlagBase *)&local_d40);
  args::FlagBase::~FlagBase((FlagBase *)&local_9d0);
  args::FlagBase::~FlagBase((FlagBase *)local_830);
  args::FlagBase::~FlagBase((FlagBase *)local_760);
  args::FlagBase::~FlagBase((FlagBase *)local_e18);
  args::FlagBase::~FlagBase((FlagBase *)&local_ef0);
  args::FlagBase::~FlagBase((FlagBase *)&local_438);
  args::FlagBase::~FlagBase((FlagBase *)&local_368);
  args::FlagBase::~FlagBase((FlagBase *)&local_298);
  args::FlagBase::~FlagBase((FlagBase *)&local_100);
  args::FlagBase::~FlagBase(&local_1c8);
  args::ArgumentParser::~ArgumentParser(&local_5c8);
  if (local_fb8[0] != local_fa8) {
    operator_delete(local_fb8[0]);
  }
  if (local_1288 != local_1278) {
    operator_delete(local_1288);
  }
  if (local_13c0 != local_13b0) {
    operator_delete(local_13c0);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv){

  int vsize=50;
  int bsize=20;
  int maxiter=5000;
  int maxtime=0;
  int max_apertures=5;
  int open_apertures=-1;
  double alpha=1.0;
  double beta=1.0;
  double maxdelta=5.0;
  double maxratio=3.0;

  //bool search_aperture=false;
  //bool search_intensity=false;
  //string strategy="dao_ls";
  //int ls_type=ApertureILS::FIRST_IMPROVEMENT;

  int initial_intensity=2;
  int max_intensity=28;
  int step_intensity=2;
  
  //bool acceptance=ILS::ACCEPT_NONE;
  //int initial_setup;

  // ls params
  //double prob_intensity=0.2;
  //double temperature, initial_temperature=10;
  //double min_temperature=0;
  //double alphaT=0.95;
  //int perturbation=2;

  string file="data/testinstance_0_70_140_210_280.txt";
  string file2="data/test_instance_coordinates.txt";
  string path=".";
  int seed=time(NULL);

  // Tabu list <<beam,station*>, open> for intensity
  //vector<pair<pair<int,Station*>,  bool > > tabu_list_inten;
  // Tabu list <<beam,station*>, <aperture,open>> for aperture
  //vector<pair<pair<int,Station*>, pair<int, bool> > > tabu_list_aper;
  //int tabusize=10;


  args::ArgumentParser parser("********* IMRT-Solver (ACO solver) *********", "Example.\n./ACO -s ibo_ls --maxiter=400 --maxdelta=8 --maxratio=6 --alpha=0.999 --beta=0.999 --bsize=5 --vsize=20 --max-apertures=4 --seed=0 --open-apertures=1 --initial-intensity=4 --step-intensity=1 --file-dep=data/Equidistantes/equidist00.txt --file-coord=data/Equidistantes/equidist-coord.txt");
  args::HelpFlag help(parser, "help", "Display this help menu", {'h', "help"});
  //args::ValueFlag<string> _format(parser, "string", "Format: (BR, BRw, 1C)", {'f'});
  //args::ValueFlag<string> _strategy(parser, "string", "Strategy  (dao_ls|ibo_ls)", {'s', "strategy"});
  args::ValueFlag<int> _bsize(parser, "int", "Number of considered beamlets for selection ("+to_string(bsize)+")", {"bsize"});
  args::ValueFlag<int> _vsize(parser, "int", "Number of considered worst voxels ("+to_string(vsize)+")", {"vsize"});
  // args::ValueFlag<int> _int0(parser, "int", "Initial intensity for beams  ("+to_string(int0)+")", {"int0"});
  args::ValueFlag<int> _maxdelta(parser, "int", "Max delta  ("+to_string(maxdelta)+")", {"maxdelta"});
  args::ValueFlag<int> _maxratio(parser, "int", "Max ratio  ("+to_string(maxratio)+")", {"maxratio"});
  args::ValueFlag<double> _alpha(parser, "double", "Initial temperature for intensities  ("+to_string(alpha)+")", {"alpha"});
  args::ValueFlag<double> _beta(parser, "double", "Initial temperature for ratio  ("+to_string(beta)+")", {"beta"});
  args::ValueFlag<int> _maxiter(parser, "int", "Number of iterations ("+to_string(maxiter)+")", {"maxiter"});
  args::ValueFlag<int> _maxtime(parser, "int", "Maximum time in seconds ("+to_string(maxtime)+")", {"maxtime"});
  args::ValueFlag<int> _seed(parser, "int", "Seed  ("+to_string(seed)+")", {"seed"});

  args::ValueFlag<int> _max_apertures(parser, "int", "Initial intensity for the station  ("+to_string(max_apertures)+")", {"max-apertures"});
  args::ValueFlag<int> _open_apertures(parser, "int", "Number of initialized open apertures (-1: all, default:"+to_string(open_apertures)+")", {"open-apertures"});
  args::ValueFlag<int> _initial_intensity(parser, "int", "Initial value aperture intensity  ("+to_string(initial_intensity)+")", {"initial-intensity"});
  args::ValueFlag<int> _max_intensity(parser, "int", "Max value aperture intensity  ("+to_string(max_intensity)+")", {"max-intensity"});
  args::ValueFlag<int> _step_intensity(parser, "int", "Step size for aperture intensity  ("+to_string(step_intensity)+")", {"step-intensity"});

  //args::Group setup (parser, "Initial solution setup (these override all provided configurations):", args::Group::Validators::DontCare);
  //args::Flag open_max(setup, "open_max", "Open aperture setup with max intensity", {"open-max-setup"});
  //args::Flag open_min(setup, "open_min", "Open aperture setup with min intensity", {"open-min-setup"});
  //args::Flag closed_min(setup, "closed_min", "Closed aperture setup with min intensity", {"closed-min-setup"});
  //args::Flag closed_max(setup, "closed_max", "Closed aperture setup with max intensity", {"closed-max-setup"});
  //args::Flag all_rand(setup, "all_rand", "Random aperture setup with random intensity", {"rand-setup"});

  //args::Group dao_ls (parser, "Direct aperture local search:", args::Group::Validators::DontCare);
  //args::Flag ls_aperture(dao_ls, "ls_apertures", "Apply aperture local search", {"ls-aperture"});
  //args::Flag ls_intensity(dao_ls, "ls_intensity", "Apply intensity local search", {"ls-intensity"});
  //args::ValueFlag<double> _prob_intensity(dao_ls, "double", "Probability to search over intensity  ("+to_string(prob_intensity)+")", {"prob-intensity"});
  //args::Flag best_improv(dao_ls, "best_improv", "Apply best improvement when searching intensity or apertures", {"best-improvement"});
  //args::Flag first_improv(dao_ls, "first_improv", "Apply first improvement when searching intensity or apertures", {"first-improvement"});
  //args::Flag do_perturbate(dao_ls, "do_perturbate", "Perturbate after a selected criterion is triggered", {"perturbate"});

  //args::Group accept (parser, "Acceptance criterion:", args::Group::Validators::AtMostOne);
  //args::Flag accept_best(accept, "accept-best", "Accept only improvement", {"accept-best"});
  //args::Flag accept_sa(accept, "accept-sa", "Accept as simulated annealing", {"accept-sa"});

  //args::ValueFlag<double> _temperature(parser, "double", "Temperature for acceptance criterion  ("+to_string(temperature)+")", {"temperature"});
  //args::ValueFlag<double> _alphaT(parser, "double", "Reduction rate of the temperature  ("+to_string(alphaT)+")", {"alphaT"});
  //args::ValueFlag<int> _perturbation(parser, "int", "Perturbation size  ("+to_string(perturbation)+")", {"perturbation-size"});

  args::Flag _plot(parser, "bool", "Generate plot and save in file", {"plot"});
  //args::Flag trace(parser, "trace", "Trace", {"trace"});
  args::ValueFlag<string> _file(parser, "string", "File with the deposition matrix", {"file-dep"});
  args::ValueFlag<string> _file2(parser, "string", "File with the beam coordinates", {"file-coord"});
  args::ValueFlag<string> _path(parser, "string", "Absolute path of the executable (if it is executed from other directory)", {"path"});

	try
	{
		parser.ParseCLI(argc, argv);

	}
	catch (args::Help&)
	{
		std::cout << parser;
		return 0;
	}
	catch (args::ParseError& e)
	{
		std::cerr << e.what() << std::endl;
		std::cerr << parser;
		return 1;
	}
	catch (args::ValidationError& e)
	{
		std::cerr << e.what() << std::endl;
		std::cerr << parser;
		return 1;
	}

  //if(_strategy) strategy=_strategy.Get();
  if(_bsize) bsize=_bsize.Get();
  if(_vsize) vsize=_vsize.Get();
  if(_maxdelta) maxdelta=_maxdelta.Get();
  if(_maxratio) maxratio=_maxratio.Get();
  if(_alpha) alpha=_alpha.Get();
  if(_beta) beta=_beta.Get();
  if(_maxiter) maxiter=_maxiter.Get();
  if(_maxtime) maxtime=_maxtime.Get();
  if(_max_apertures) max_apertures=_max_apertures.Get();
  if(_open_apertures) open_apertures=_open_apertures.Get();
  if(_seed) seed=_seed.Get();
  if(_initial_intensity) initial_intensity=_initial_intensity.Get();
  if(_max_intensity) max_intensity=_max_intensity.Get();
  if(_step_intensity) step_intensity=_step_intensity.Get();
  //if(_prob_intensity) prob_intensity=_prob_intensity.Get();
  //if(_temperature) temperature=initial_temperature=_temperature.Get();
  //if(_alphaT) alphaT=_alphaT.Get();
  //if (ls_aperture) search_aperture=true;
  //if (ls_intensity) search_intensity=true;
  //if(!ls_aperture && !ls_intensity){
  //  search_aperture=true;
  //  search_intensity=true;
  //}
  //if (first_improv) ls_type=ApertureILS::FIRST_IMPROVEMENT;
  //if (best_improv) ls_type=ApertureILS::BEST_IMPROVEMENT;
  //if (accept_sa) acceptance=ILS::ACCEPT_SA;
  //if (accept_best) acceptance=ILS::ACCEPT_NONE;
  //if (_perturbation) perturbation=_perturbation.Get();

  srand(seed);

  //This should be at the end given that will modify values
  /*if(open_max) {
    initial_setup=Station::OPEN_MAX_SETUP;
    initial_intensity=max_intensity;
  } else if (open_min) {
    initial_setup=Station::OPEN_MIN_SETUP;
    initial_intensity=0;
  } else if (closed_min) {
    initial_setup=Station::CLOSED_MIN_SETUP;
    initial_intensity=0;
  } else if (closed_max) {
    initial_setup=Station::CLOSED_MAX_SETUP;
    initial_intensity=max_intensity;
  } else if (all_rand) {
    if(strategy=="dao_ls")
      initial_setup=Station::RAND_RAND_SETUP;
    else if (strategy=="ibo_ls")
      initial_setup=Station::RAND_INTENSITIES;
 }  else {
    initial_setup=Station::MANUAL_SETUP;
 }*/
    
  if (_file) file=_file.Get();
  if (_file2) file2=_file2.Get();
  if (_path) path=_path.Get();

  chdir(path.c_str());

  cout << "##**************************************************************************"<< endl;
  cout << "##**************************************************************************"<< endl;
  //if(strategy=="dao_ls")
    cout << "##******** IMRT-Solver (Ant Colony Optimization) *********"<< endl;
  //else if(strategy=="ibo_ls")
  //  cout << "##******** IMRT-Solver (Intensity-based Optimization Local Search) *********"<< endl;
  cout << "##**************************************************************************"<< endl;
  cout << "##**************************************************************************"<< endl;

  vector<double> w={1,1,1};
  vector<double> Zmin={0,0,76};
  vector<double> Zmax={65,60,1000};

  Collimator collimator(file2, get_angles(file, 5));
  vector<Volume> volumes= createVolumes (file, collimator);

  //Plan P(w, Zmin, Zmax, collimator, volumes, max_apertures, max_intensity, initial_intensity, step_intensity, open_apertures, initial_setup);

  //double best_eval=P.getEvaluation();

  cout << "##" << endl;
  cout << "##**************************************************************************"<< endl;
  cout << "##*********************************** INFO *********************************"<< endl;
  cout << "##**************************************************************************"<< endl;
  cout << "##" << endl << "## Solver: "<< endl;
  cout << "##   Iterations: " << maxiter << endl;
  cout << "##   Time: " << maxtime << endl;
  cout << "##   Seed: " << seed << endl;
  //cout << "##   Temperature: " << temperature << endl;
  cout << "##   alpha: " << alpha << endl;
  //if (search_aperture)
  //  cout << "##   Searching: aperture pattern" << endl;
  //if (search_intensity)
  //  cout << "##   Searching: intensity" << endl;
  //cout << "##   Probability intensity ls: " << prob_intensity << endl;
  //if (strategy=="dao_ls" && ls_type==ApertureILS::FIRST_IMPROVEMENT)
  //  cout << "##   Local search: first improvement"  << endl;
  //if (strategy=="dao_ls" && ls_type==ApertureILS::BEST_IMPROVEMENT)
  //  cout << "##   Local search: best improvement"  << endl;
  //cout << "##   Open initial setup: " ;
  //if (initial_setup==Station::OPEN_MAX_SETUP) cout << "open max intensity" << endl;
  //else if (initial_setup==Station::OPEN_MIN_SETUP) cout << "open min intensity" << endl;
  //else if (initial_setup==Station::CLOSED_MAX_SETUP) cout << "closed max intensity" << endl;
  //else if (initial_setup==Station::CLOSED_MIN_SETUP) cout << "closed min intensity" << endl;
  //else if (initial_setup==Station::RAND_RAND_SETUP) cout << "random" << endl;
  //else if (initial_setup==Station::RAND_INTENSITIES) cout << "random" << endl;
  //else cout << "manual, " << open_apertures << " open apertures" << endl;
  
  cout << "##   Initial intensity: " << initial_intensity << endl;
  cout << "##   Max intensity: " << max_intensity << endl;
  cout << "##   Step intensity: " << step_intensity << endl;
  //cout << "##   Perturbation size: " << perturbation << endl;
  
  cout << "##" << endl << "## Colimator configuration: "<< endl;
  cout << "##   Stations: " << collimator.getNbAngles() << endl;
  cout << "##   Angles: ";
  for (int i=0; i<collimator.getNbAngles();i++) cout << collimator.getAngle(i) << " ";
  cout << endl;
  cout << "##   Apertures: " << max_apertures << endl;


  cout << "##" << endl << "## Instance information: "<< endl;
  cout << "##   Volumes: " << volumes.size() << endl;

  cout << "##" << endl << "##**************************************************************************"<< endl;
  cout << "##********************************** SEARCH ********************************"<< endl;
  cout << "##**************************************************************************"<< endl;



  //cout << "## Initial solution: " << best_eval << endl;
  //cout  << "##" << endl;

  collimator.generateReference ();
  collimator.generateIntensityLevels (step_intensity,max_intensity);
  //collimator.printReference ();

  ACO* aco = new ACS(w, Zmin, Zmax, collimator, volumes, max_apertures, max_intensity, initial_intensity, step_intensity,10, 1, 2, 2, 0.2);
  aco->search(900);
  //aco->evaporation();
  //aco->printPheromone();
  //aco->printAnts();
  //aco->generateTours();
  //aco->printAnts();
  
  
  //if(strategy=="dao_ls")
   // ils = new ApertureILS(bsize, vsize, search_intensity, search_aperture,
   //                       prob_intensity, step_intensity, initial_temperature,
   //                       alphaT, do_perturbate, perturbation, acceptance, ls_type);
  //else if(strategy=="ibo_ls")
    //ils = new IntensityILS(step_intensity, bsize, vsize, maxdelta, maxratio, alpha, beta, perturbation);

  //ils-> notTargetedSearch(P, maxtime, maxiter);


  cout << "##**************************************************************************"<< endl;
  cout << "##******************************* RESULTS **********************************"<< endl;
  cout << "##**************************************************************************"<< endl;
  cout << "##"<<endl;
  
 // cout << "## Best solution found: " <<  P.getEvaluation() << endl;
  //cout <<  P.getEvaluation() << " ";

 /* const list<Station*> stations=P.get_stations();

  int tot_alpha=0;
  for(auto s:stations){
    int alpha=s->get_sum_alpha(strategy);
    cout << alpha << " " ;
    tot_alpha+=alpha;
  }
  cout << tot_alpha << " ";

  int nb_apertures=0;
  for(auto s:stations){
    int ap=s->get_nb_apertures(strategy);
    cout << ap << " " ;
    nb_apertures+=ap;
  }
  cout << nb_apertures << endl;*/


	/*cout << endl;
	for(int i=0;i<5;i++)
		P.printIntensity(i);

	cout << endl;
  */

/*
	cout << "********   Summary of the results    *********"<< endl;
	best_eval = F.eval(P,w,Zmin,Zmax);
	cout << "Final solution: " << best_eval << endl << endl;

  F.generate_voxel_dose_functions ();
  */
  /*set<int> l = get_angles(file, 5);
  if(_plot){
	  std::stringstream ss;
	  ss << "python plotter/plot.py " << *l.begin()/5 << "_" << strategy << "_" << initial_intensity << "_" << initial_setup << "_" << maxtime << "_" << seed <<".pdf";
	  std::string s = ss.str();
	  system(s.c_str());
  }
*/
	return 0;

}